

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::Print<char>::operator()
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Print<char> *this,mode *first,char (*args) [8],char (*args_1) [16],char (*args_2) [15])

{
  int iVar1;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (*first == str) {
    if (operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
        ::oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                    ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                     &operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                             ::oss_abi_cxx11_);
      }
    }
    local_48 = 0;
    local_40 = 0;
    local_50 = &local_40;
    std::__cxx11::stringbuf::str((string *)&DAT_0015b890);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    std::ios::clear((int)*(undefined8 *)
                          (operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                           ::oss_abi_cxx11_ + -0x18) + 0x15b888);
    print_backend<std::__cxx11::ostringstream&,char_const(&)[8],char_const(&)[16],char_const(&)[15]>
              (this,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &operator()<char_const(&)[8],char_const(&)[16],char_const(&)[15]>(ptc::mode&&,char_const&[],char_const&[],char_const&[])
                     ::oss_abi_cxx11_,args,args_1,args_2);
    std::__cxx11::stringbuf::str();
  }
  else {
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_50,local_50 + local_48);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }